

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.hpp
# Opt level: O3

void __thiscall
duckdb::LineError::Insert
          (LineError *this,CSVErrorType *type,idx_t *col_idx,idx_t *chunk_idx,
          LinePosition *error_position,idx_t current_line_size)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  reference pvVar2;
  CurrentError local_70;
  
  this->is_error_in_line = true;
  if (this->ignore_errors == false) {
    local_70.type = *type;
    local_70.col_idx = *col_idx;
    local_70.chunk_idx = *chunk_idx;
    paVar1 = &local_70.error_message.field_2;
    local_70.error_message._M_string_length = 0;
    local_70.error_message.field_2._M_local_buf[0] = '\0';
    local_70.error_position.buffer_pos = error_position->buffer_pos;
    local_70.error_position.buffer_size = error_position->buffer_size;
    local_70.error_position.buffer_idx = error_position->buffer_idx;
    local_70.current_line_size = current_line_size;
    local_70.error_message._M_dataplus._M_p = (pointer)paVar1;
    ::std::vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>::
    emplace_back<duckdb::CurrentError>
              ((vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_> *)this,&local_70
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.error_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_70.error_message._M_dataplus._M_p);
    }
    pvVar2 = vector<duckdb::CurrentError,_true>::back(&this->current_errors);
    pvVar2->current_line_size = current_line_size;
  }
  return;
}

Assistant:

void Insert(const CSVErrorType &type, const idx_t &col_idx, const idx_t &chunk_idx,
	            const LinePosition &error_position, const idx_t current_line_size = 0) {
		is_error_in_line = true;
		if (!ignore_errors) {
			// We store it for later
			current_errors.push_back({type, col_idx, chunk_idx, error_position, current_line_size});
			current_errors.back().current_line_size = current_line_size;
		}
	}